

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAWInteractionType.hpp
# Opt level: O1

void __thiscall OpenMD::MAWInteractionType::~MAWInteractionType(MAWInteractionType *this)

{
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_00304d78;
  (this->super_NonBondedInteractionType).properties_._vptr_PropertyMap =
       (_func_int **)&PTR__PropertyMap_003022b0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
  ::~_Rb_tree(&(this->super_NonBondedInteractionType).properties_.propMap_._M_t);
  operator_delete(this,0x88);
  return;
}

Assistant:

MAWInteractionType(RealType myD0, RealType myBeta0, RealType myR0,
                       RealType myCa1, RealType myCb1) {
      D_e  = myD0;
      beta = myBeta0;
      r_e  = myR0;
      ca1  = myCa1;
      cb1  = myCb1;
      setMAW();
    }